

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyScanTable
              (Scl_Tree_t *p,Vec_Ptr_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  Vec_Flt_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void *pvVar9;
  Vec_Flt_t *pVVar10;
  int *piVar11;
  void **ppvVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Scl_Item_t *pSVar16;
  int iVar17;
  Vec_Flt_t *pVec;
  uint uVar18;
  Vec_Ptr_t *pVVar19;
  Vec_Flt_t *local_50;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  uVar13 = pTiming->Child;
  iVar3 = p->nItems;
  if ((int)uVar13 < iVar3) {
    if ((int)uVar13 < 0) {
      return 0;
    }
    if (p->pItems == (Scl_Item_t *)0x0) {
      return 0;
    }
    pSVar16 = p->pItems + uVar13;
    pcVar5 = p->pContents;
    while( true ) {
      iVar2 = (pSVar16->Key).Beg;
      iVar17 = (pSVar16->Key).End - iVar2;
      iVar2 = strncmp(pcVar5 + iVar2,pName,(long)iVar17);
      if ((iVar2 == 0) && (sVar4 = strlen(pName), iVar17 == (int)sVar4)) break;
      uVar13 = pSVar16->Next;
      if (iVar3 <= (int)uVar13) goto LAB_003d2993;
      if ((int)uVar13 < 0) {
        return 0;
      }
      pSVar16 = p->pItems + uVar13;
      if (p->pItems == (Scl_Item_t *)0x0) {
        return 0;
      }
    }
    pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
    if (*pcVar5 == '\0') {
      uVar13 = pSVar16->Child;
      if ((int)uVar13 < p->nItems) {
        if ((-1 < (int)uVar13) && (p->pItems != (Scl_Item_t *)0x0)) {
          pSVar16 = p->pItems + uVar13;
          local_50 = (Vec_Flt_t *)0x0;
          pVVar6 = (Vec_Flt_t *)0x0;
          pVVar10 = (Vec_Flt_t *)0x0;
          do {
            iVar3 = (pSVar16->Key).Beg;
            pcVar5 = p->pContents + iVar3;
            iVar3 = (pSVar16->Key).End - iVar3;
            sVar4 = (size_t)iVar3;
            iVar2 = strncmp(pcVar5,"index_1",sVar4);
            if (iVar3 == 7 && iVar2 == 0) {
              if (pVVar10 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex1 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x40f,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
              pVVar10 = Scl_LibertyReadFloatVec(pcVar5);
            }
            else {
              iVar2 = strncmp(pcVar5,"index_2",sVar4);
              if ((iVar3 == 7) && (iVar2 == 0)) {
                if (pVVar6 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vIndex2 == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                                ,0x411,
                                "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
                pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
              }
              else {
                iVar2 = strncmp(pcVar5,"values",sVar4);
                if ((iVar3 == 6) && (iVar2 == 0)) {
                  if (local_50 != (Vec_Flt_t *)0x0) {
                    __assert_fail("vValues == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                                  ,0x413,
                                  "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                                 );
                  }
                  pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
                  local_50 = Scl_LibertyReadFloatVec(pcVar5);
                }
              }
            }
            uVar13 = pSVar16->Next;
            if (p->nItems <= (int)uVar13) goto LAB_003d2993;
          } while ((-1 < (int)uVar13) &&
                  (pSVar16 = p->pItems + uVar13, p->pItems != (Scl_Item_t *)0x0));
          if ((pVVar10 != (Vec_Flt_t *)0x0) &&
             ((pVVar6 != (Vec_Flt_t *)0x0 && (local_50 != (Vec_Flt_t *)0x0)))) {
            uVar13 = vOut->nCap;
            uVar18 = vOut->nSize;
            if (uVar18 == uVar13) {
              if ((int)uVar18 < 0x10) {
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(0x80);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = 0x10;
                uVar13 = 0x10;
              }
              else {
                uVar13 = uVar18 * 2;
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc((ulong)uVar18 << 4);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,(ulong)uVar18 << 4);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = uVar13;
              }
            }
            else {
              ppvVar12 = vOut->pArray;
            }
            iVar3 = vOut->nSize;
            vOut->nSize = iVar3 + 1U;
            ppvVar12[iVar3] = pVVar10;
            if (iVar3 + 1U == uVar13) {
              if (iVar3 < 0xf) {
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(0x80);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = 0x10;
                uVar13 = 0x10;
              }
              else {
                uVar13 = uVar13 * 2;
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc((ulong)uVar13 * 8);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,(ulong)uVar13 * 8);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = uVar13;
              }
            }
            else {
              ppvVar12 = vOut->pArray;
            }
            iVar3 = vOut->nSize;
            vOut->nSize = iVar3 + 1U;
            ppvVar12[iVar3] = pVVar6;
            if (iVar3 + 1U == uVar13) {
              if (iVar3 < 0xf) {
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(0x80);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)(uVar13 * 2) * 8;
                if (vOut->pArray == (void **)0x0) {
                  ppvVar12 = (void **)malloc(sVar4);
                }
                else {
                  ppvVar12 = (void **)realloc(vOut->pArray,sVar4);
                }
                vOut->pArray = ppvVar12;
                vOut->nCap = uVar13 * 2;
              }
            }
            else {
              ppvVar12 = vOut->pArray;
            }
            iVar3 = vOut->nSize;
            vOut->nSize = iVar3 + 1;
            ppvVar12[iVar3] = local_50;
            return 1;
          }
        }
        pcVar5 = "Incomplete table specification";
LAB_003d20fb:
        puts(pcVar5);
        return 0;
      }
    }
    else {
      iVar3 = strcmp(pcVar5,"scalar");
      if (iVar3 == 0) {
        uVar13 = pSVar16->Child;
        if ((int)uVar13 < p->nItems) {
          if ((int)uVar13 < 0) {
            return 1;
          }
          pSVar16 = p->pItems;
          if (pSVar16 == (Scl_Item_t *)0x0) {
            return 1;
          }
          iVar3 = pSVar16[uVar13].Key.Beg;
          iVar2 = pSVar16[uVar13].Key.End - iVar3;
          iVar3 = strncmp(p->pContents + iVar3,"values",(long)iVar2);
          if (iVar2 != 6 || iVar3 != 0) {
            puts("Cannot read \"scalar\" template");
            return 0;
          }
          pcVar5 = Scl_LibertyReadString(p,pSVar16[uVar13].Head);
          pVVar10 = Scl_LibertyReadFloatVec(pcVar5);
          if (pVVar10->nSize == 1) {
            pVVar7 = Vec_IntStart((int)pcVar5);
            pVVar19 = vOut;
            Vec_PtrPush(vOut,pVVar7);
            pVVar7 = Vec_IntStart((int)pVVar19);
            Vec_PtrPush(vOut,pVVar7);
            Vec_PtrPush(vOut,pVVar10);
            return 1;
          }
          __assert_fail("Vec_FltSize(vValues) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x426,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
      }
      else {
        uVar13 = vTemples->nSize;
        if ((int)uVar13 < 1) {
LAB_003d1f64:
          pcVar5 = "Template cannot be found in the template library";
          goto LAB_003d20fb;
        }
        uVar15 = 0;
        while (((uVar15 & 3) != 0 ||
               (iVar3 = strcmp(pcVar5,(char *)vTemples->pArray[uVar15]), iVar3 != 0))) {
          uVar15 = uVar15 + 1;
          if (uVar13 == uVar15) goto LAB_003d1f64;
        }
        uVar18 = pSVar16->Child;
        if (p->nItems <= (int)uVar18) goto LAB_003d2993;
        if (((int)uVar18 < 0) || (p->pItems == (Scl_Item_t *)0x0)) {
          local_38 = (Vec_Flt_t *)0x0;
          local_40 = (Vec_Flt_t *)0x0;
          local_48 = (Vec_Flt_t *)0x0;
          goto LAB_003d234d;
        }
        pSVar16 = p->pItems + uVar18;
        local_48 = (Vec_Flt_t *)0x0;
        local_40 = (Vec_Flt_t *)0x0;
        local_38 = (Vec_Flt_t *)0x0;
        while( true ) {
          iVar3 = (pSVar16->Key).Beg;
          pcVar5 = p->pContents + iVar3;
          iVar3 = (pSVar16->Key).End - iVar3;
          sVar4 = (size_t)iVar3;
          iVar2 = strncmp(pcVar5,"index_1",sVar4);
          if (iVar3 == 7 && iVar2 == 0) {
            if (local_38 != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex1 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x440,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
            local_38 = Scl_LibertyReadFloatVec(pcVar5);
          }
          else {
            iVar2 = strncmp(pcVar5,"index_2",sVar4);
            if ((iVar3 == 7) && (iVar2 == 0)) {
              if (local_40 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex2 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x442,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
              local_40 = Scl_LibertyReadFloatVec(pcVar5);
            }
            else {
              iVar2 = strncmp(pcVar5,"values",sVar4);
              if ((iVar3 == 6) && (iVar2 == 0)) {
                if (local_48 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vValues == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                                ,0x444,
                                "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar5 = Scl_LibertyReadString(p,pSVar16->Head);
                local_48 = Scl_LibertyReadFloatVec(pcVar5);
              }
            }
          }
          uVar13 = pSVar16->Next;
          if (p->nItems <= (int)uVar13) break;
          if (((int)uVar13 < 0) || (pSVar16 = p->pItems + uVar13, p->pItems == (Scl_Item_t *)0x0)) {
            uVar13 = vTemples->nSize;
LAB_003d234d:
            if (((int)uVar13 <= (int)uVar15 + 2) || (uVar13 <= (int)uVar15 + 3U)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            ppvVar12 = vTemples->pArray;
            pVVar10 = (Vec_Flt_t *)ppvVar12[uVar15 + 2];
            pVVar6 = (Vec_Flt_t *)ppvVar12[uVar15 + 3];
            if (*(long *)((long)ppvVar12 + ((uVar15 & 0xffffffff) << 3 | 8)) == 0) {
              if ((local_38 != (Vec_Flt_t *)0x0) && (local_38->nSize != pVVar10->nSize)) {
                __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,1099,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pVec = pVVar6;
              if ((local_40 != (Vec_Flt_t *)0x0) &&
                 (pVec = local_40, local_40->nSize != pVVar6->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x44c,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_38 != (Vec_Flt_t *)0x0) {
                pVVar10 = local_38;
              }
              pVVar10 = Vec_FltDup(pVVar10);
              Vec_PtrPush(vOut,pVVar10);
              pVVar10 = Vec_FltDup(pVec);
              Vec_PtrPush(vOut,pVVar10);
              pVVar10 = Vec_FltDup(local_48);
              Vec_PtrPush(vOut,pVVar10);
            }
            else {
              uVar13 = local_48->nSize;
              piVar8 = (int *)malloc(0x10);
              uVar15 = 0x10;
              if (0xe < uVar13 - 1) {
                uVar15 = (ulong)uVar13;
              }
              piVar8[1] = 0;
              iVar3 = (int)uVar15;
              *piVar8 = iVar3;
              if (iVar3 == 0) {
                pvVar9 = (void *)0x0;
              }
              else {
                pvVar9 = malloc((long)iVar3 << 2);
              }
              *(void **)(piVar8 + 2) = pvVar9;
              if ((local_40 != (Vec_Flt_t *)0x0) && (local_40->nSize != pVVar10->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x457,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_38 == (Vec_Flt_t *)0x0) {
                iVar3 = pVVar6->nSize;
              }
              else {
                iVar3 = local_38->nSize;
                piVar11 = &pVVar6->nSize;
                pVVar6 = local_38;
                if (iVar3 != *piVar11) {
                  __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                                ,0x458,
                                "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
              }
              if (local_40 != (Vec_Flt_t *)0x0) {
                pVVar10 = local_40;
              }
              uVar13 = iVar3 * pVVar10->nSize;
              if (uVar13 != local_48->nSize) {
                __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x45c,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              uVar18 = 0;
              if (0 < (int)uVar13) {
                iVar3 = 0;
                do {
                  uVar14 = (iVar3 % pVVar6->nSize) * pVVar10->nSize + iVar3 / pVVar6->nSize;
                  if (((int)uVar14 < 0) || (uVar13 <= uVar14)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                  }
                  fVar1 = local_48->pArray[uVar14];
                  uVar13 = (uint)uVar15;
                  if (uVar18 == uVar13) {
                    if ((int)uVar13 < 0x10) {
                      if (pvVar9 == (void *)0x0) {
                        pvVar9 = malloc(0x40);
                      }
                      else {
                        pvVar9 = realloc(pvVar9,0x40);
                      }
                      uVar15 = 0x10;
                    }
                    else {
                      uVar15 = (ulong)(uVar13 * 2);
                      if (pvVar9 == (void *)0x0) {
                        pvVar9 = malloc(uVar15 * 4);
                      }
                      else {
                        pvVar9 = realloc(pvVar9,uVar15 * 4);
                      }
                    }
                    *(void **)(piVar8 + 2) = pvVar9;
                    *piVar8 = (int)uVar15;
                  }
                  iVar2 = piVar8[1];
                  uVar18 = iVar2 + 1;
                  piVar8[1] = uVar18;
                  *(float *)((long)pvVar9 + (long)iVar2 * 4) = fVar1;
                  iVar3 = iVar3 + 1;
                  uVar13 = local_48->nSize;
                } while (iVar3 < (int)uVar13);
              }
              if (uVar13 != uVar18) {
                __assert_fail("Vec_FltSize(vValues) == Vec_FltSize(vValues2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x464,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              piVar11 = (int *)malloc(0x10);
              iVar3 = pVVar10->nSize;
              piVar11[1] = iVar3;
              iVar2 = pVVar10->nCap;
              *piVar11 = iVar2;
              if ((long)iVar2 == 0) {
                pvVar9 = (void *)0x0;
              }
              else {
                pvVar9 = malloc((long)iVar2 << 2);
              }
              *(void **)(piVar11 + 2) = pvVar9;
              memcpy(pvVar9,pVVar10->pArray,(long)iVar3 << 2);
              uVar13 = vOut->nCap;
              uVar18 = vOut->nSize;
              if (uVar18 == uVar13) {
                if ((int)uVar18 < 0x10) {
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = 0x10;
                  uVar13 = 0x10;
                }
                else {
                  uVar13 = uVar18 * 2;
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc((ulong)uVar18 << 4);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,(ulong)uVar18 << 4);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = uVar13;
                }
              }
              else {
                ppvVar12 = vOut->pArray;
              }
              iVar3 = vOut->nSize;
              vOut->nSize = iVar3 + 1U;
              ppvVar12[iVar3] = piVar11;
              piVar11 = (int *)malloc(0x10);
              iVar2 = pVVar6->nSize;
              piVar11[1] = iVar2;
              iVar17 = pVVar6->nCap;
              *piVar11 = iVar17;
              if ((long)iVar17 == 0) {
                pvVar9 = (void *)0x0;
              }
              else {
                pvVar9 = malloc((long)iVar17 << 2);
              }
              *(void **)(piVar11 + 2) = pvVar9;
              memcpy(pvVar9,pVVar6->pArray,(long)iVar2 << 2);
              if (iVar3 + 1U == uVar13) {
                if (iVar3 < 0xf) {
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = 0x10;
                  uVar13 = 0x10;
                }
                else {
                  uVar13 = uVar13 * 2;
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc((ulong)uVar13 * 8);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,(ulong)uVar13 * 8);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = uVar13;
                }
              }
              else {
                ppvVar12 = vOut->pArray;
              }
              iVar3 = vOut->nSize;
              vOut->nSize = iVar3 + 1U;
              ppvVar12[iVar3] = piVar11;
              if (iVar3 + 1U == uVar13) {
                if (iVar3 < 0xf) {
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,0x80);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = 0x10;
                }
                else {
                  sVar4 = (ulong)(uVar13 * 2) * 8;
                  if (vOut->pArray == (void **)0x0) {
                    ppvVar12 = (void **)malloc(sVar4);
                  }
                  else {
                    ppvVar12 = (void **)realloc(vOut->pArray,sVar4);
                  }
                  vOut->pArray = ppvVar12;
                  vOut->nCap = uVar13 * 2;
                }
              }
              else {
                ppvVar12 = vOut->pArray;
              }
              iVar3 = vOut->nSize;
              vOut->nSize = iVar3 + 1;
              ppvVar12[iVar3] = piVar8;
            }
            if (local_38 != (Vec_Flt_t *)0x0) {
              if (local_38->pArray != (float *)0x0) {
                free(local_38->pArray);
              }
              free(local_38);
            }
            if (local_40 != (Vec_Flt_t *)0x0) {
              if (local_40->pArray != (float *)0x0) {
                free(local_40->pArray);
              }
              free(local_40);
            }
            if (local_48 != (Vec_Flt_t *)0x0) {
              if (local_48->pArray != (float *)0x0) {
                free(local_48->pArray);
              }
              free(local_48);
              return 1;
            }
            return 1;
          }
        }
      }
    }
  }
LAB_003d2993:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyScanTable( Scl_Tree_t * p, Vec_Ptr_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_PtrPush( vOut, vInd1 );
        Vec_PtrPush( vOut, vInd2 );
        Vec_PtrPush( vOut, vValues );
    }
    else if ( !strcmp(pTempl, "scalar") )
    {
        Scl_ItemForEachChild( p, pTable, pItem )
            if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
            {
                assert(vValues == NULL);
                vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
                assert( Vec_FltSize(vValues) == 1 );
                // write entries
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, vValues );
                break;
            }
            else
            { printf( "Cannot read \"scalar\" template\n" ); return 0; }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, Vec_FltDup(vValues) );
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            Vec_Flt_t * vValues2 = Vec_FltAlloc( Vec_FltSize(vValues) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_FltPush( vValues2, Entry );
            }
            assert( Vec_FltSize(vValues) == Vec_FltSize(vValues2) );
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, vValues2 );
        }
        Vec_FltFreeP( &vIndex1 );
        Vec_FltFreeP( &vIndex2 );
        Vec_FltFreeP( &vValues );
    }
    return 1;
}